

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.h
# Opt level: O1

cstr idx2::ToString<idx2::mmap_err_code>(error<idx2::mmap_err_code> *Err,bool Force)

{
  mmap_err_code mVar1;
  name_map *pnVar2;
  long lVar3;
  undefined7 in_register_00000031;
  long lVar4;
  long *in_FS_OFFSET;
  bool bVar5;
  
  if (((int)CONCAT71(in_register_00000031,Force) != 0) || (Err->StrGened == false)) {
    mVar1 = mmap_err_code_s::NameMap.Arr[0].ItemVal;
    if (mmap_err_code_s::NameMap.Arr[0].ItemVal != Err->Code) {
      lVar3 = 0x28;
      do {
        if (lVar3 == 0x298) {
          mVar1 = __Invalid__;
          break;
        }
        mVar1 = *(mmap_err_code *)((long)&mmap_err_code_s::NameMap.Arr[0].Name.field_0 + lVar3);
        lVar3 = lVar3 + 0x18;
      } while (mVar1 != Err->Code);
    }
    if (mmap_err_code_s::NameMap.Arr[0].ItemVal == mVar1) {
      pnVar2 = &mmap_err_code_s::NameMap;
      bVar5 = false;
    }
    else {
      lVar3 = 0;
      do {
        lVar4 = lVar3;
        bVar5 = lVar4 == 0x270;
        if (bVar5) goto LAB_001097de;
        lVar3 = lVar4 + 0x18;
      } while (*(mmap_err_code *)((long)&mmap_err_code_s::NameMap.Arr[1].ItemVal + lVar4) != mVar1);
      pnVar2 = (name_map *)((long)&mmap_err_code_s::NameMap.Arr[1].Name.field_0 + lVar4);
    }
    if (bVar5) {
LAB_001097de:
      __assert_fail("It != End(EnumS.NameMap)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Applications/../Core/MemoryMap.h"
                    ,0x28,"stref idx2::ToString(mmap_err_code)");
    }
    snprintf((char *)(*in_FS_OFFSET + -0xf80),0x400,"%.*s (file: %s, line %d): %s",
             (ulong)(uint)pnVar2->Arr[0].Name.Size,pnVar2->Arr[0].Name.field_0.Ptr,
             in_FS_OFFSET[-0x110],(ulong)*(uint *)(in_FS_OFFSET + -0xd0),Err->Msg);
  }
  return (cstr)(*in_FS_OFFSET + -0xf80);
}

Assistant:

cstr
ToString(const error<t>& Err, bool Force)
{
  if (Force || !Err.StrGened)
  {
    auto ErrStr = ToString(Err.Code);
    snprintf(ScratchBuf,
             sizeof(ScratchBuf),
             "%.*s (file: %s, line %d): %s",
             ErrStr.Size,
             ErrStr.Ptr,
             Err.Files[0],
             Err.Lines[0],
             Err.Msg);
  }
  return ScratchBuf;
}